

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O1

void __thiscall Minisat::Solver::MyQueue<int>::push(MyQueue<int> *this,int e)

{
  int iVar1;
  
  if (this->q_sz < this->max_sz) {
    this->q_sz = this->q_sz + 1;
  }
  else {
    this->sum = this->sum - (long)(this->q).data[this->ptr];
  }
  this->sum = this->sum + (long)e;
  iVar1 = this->ptr;
  this->ptr = iVar1 + 1;
  (this->q).data[iVar1] = e;
  if (this->ptr == this->max_sz) {
    this->ptr = 0;
  }
  return;
}

Assistant:

void push(T e)
        {
            if (q_sz < max_sz)
                q_sz++;
            else
                sum -= q[ptr];
            sum += e;
            q[ptr++] = e;
            if (ptr == max_sz) ptr = 0;
        }